

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_mapper.cpp
# Opt level: O3

int __thiscall
icu_63::number::impl::PropertiesAffixPatternProvider::length
          (PropertiesAffixPatternProvider *this,int flags)

{
  short sVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar3 = 8;
  if (((uint)flags >> 8 & 1) == 0) {
    uVar3 = (ulong)((flags & 0x200U) >> 2) | 0x48;
  }
  uVar2 = 0x88;
  if ((~flags & 0x300U) != 0) {
    uVar2 = uVar3;
  }
  sVar1 = *(short *)((long)&(this->posPrefix).super_Replaceable.super_UObject._vptr_UObject + uVar2)
  ;
  if (sVar1 < 0) {
    return *(int *)((long)&(this->posPrefix).super_Replaceable.super_UObject._vptr_UObject +
                   uVar2 + 4);
  }
  return (int)sVar1 >> 5;
}

Assistant:

const UnicodeString& PropertiesAffixPatternProvider::getStringInternal(int32_t flags) const {
    bool prefix = (flags & AFFIX_PREFIX) != 0;
    bool negative = (flags & AFFIX_NEGATIVE_SUBPATTERN) != 0;
    if (prefix && negative) {
        return negPrefix;
    } else if (prefix) {
        return posPrefix;
    } else if (negative) {
        return negSuffix;
    } else {
        return posSuffix;
    }
}